

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int ffgextn(fitsfile *fptr,LONGLONG offset,LONGLONG nelem,void *buffer,int *status)

{
  int iVar1;
  undefined8 in_RCX;
  LONGLONG in_RDX;
  fitsfile *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  int err_mode;
  int local_4;
  
  err_mode = (int)((ulong)in_RCX >> 0x20);
  if (*in_R8 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000d8,in_stack_000000d0), 0 < iVar1)) {
        return *in_R8;
      }
    }
    else {
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
    }
    ffmbyt(in_RSI,in_RDX,err_mode,in_R8);
    ffgbyt(fptr,offset,(void *)nelem,(int *)buffer);
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffgextn( fitsfile *fptr,        /* I - FITS file pointer                        */
            LONGLONG  offset,      /* I - byte offset from start of extension data */
            LONGLONG  nelem,       /* I - number of elements to read               */
            void *buffer,          /* I - stream of bytes to read                  */
            int  *status)          /* IO - error status                            */
/*
  Read a stream of bytes from the current FITS HDU.  This primative routine is mainly
  for reading non-standard "conforming" extensions and should not be used
  for standard IMAGE, TABLE or BINTABLE extensions.
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    /* move to write position */
    ffmbyt(fptr, (fptr->Fptr)->datastart+ offset, IGNORE_EOF, status);
    
    /* read the buffer */
    ffgbyt(fptr, nelem, buffer, status); 

    return(*status);
}